

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::
TypedExpectation<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
::~TypedExpectation(TypedExpectation<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
                    *this)

{
  Action<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
  *this_00;
  bool bVar1;
  reference ppvVar2;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_28;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_20;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_18;
  const_iterator it;
  TypedExpectation<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
  *this_local;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_003cf880;
  it._M_current = (void **)this;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  local_20._M_current =
       (void **)std::vector<const_void_*,_std::allocator<const_void_*>_>::begin
                          (&(this->super_ExpectationBase).untyped_actions_);
  __gnu_cxx::
  __normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>::
  __normal_iterator<void_const**>
            ((__normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (void **)std::vector<const_void_*,_std::allocator<const_void_*>_>::end
                            (&(this->super_ExpectationBase).untyped_actions_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              ::operator*(&local_18);
    this_00 = (Action<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
               *)*ppvVar2;
    if (this_00 !=
        (Action<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
         *)0x0) {
      Action<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
      ::~Action(this_00);
      operator_delete(this_00,0x20);
    }
    __gnu_cxx::
    __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
    ::operator++(&local_18);
  }
  Action<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
  ::~Action(&this->repeated_action_);
  Matcher<const_std::tuple<pstore::address,_unsigned_long,_bool>_&>::~Matcher(&this->extra_matcher_)
  ;
  std::
  tuple<testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>_>
  ::~tuple(&this->matchers_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }